

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_move_scalar_from_top(Parser *this)

{
  byte *pbVar1;
  uint uVar2;
  State *pSVar3;
  size_t sVar4;
  State *pSVar5;
  code *pcVar6;
  size_t sVar7;
  Location LVar8;
  undefined1 auVar9 [24];
  Location LVar10;
  bool bVar11;
  char msg [42];
  char local_a8 [48];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  if (1 < (this->m_stack).m_size) {
    pSVar3 = (this->m_stack).m_stack;
    sVar4 = (this->m_stack).m_size;
    pSVar5 = this->m_state;
    if (sVar4 == 0) {
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = '\\';
      local_a8[9] = '\\';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = '\x1d';
      local_a8[0x19] = -0x59;
      local_a8[0x1a] = '$';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 0x65;
      local_a8[0x21] = 0;
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    }
    if (pSVar5 != (this->m_stack).m_stack + ((this->m_stack).m_size - 1)) {
      builtin_strncpy(local_a8 + 0x10,"_state == &m_stack.top())",0x1a);
      builtin_strncpy(local_a8,"check failed: (m",0x10);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      local_50 = 0;
      uStack_48 = 0x7941;
      local_40 = 0;
      pcStack_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_30 = 0x65;
      auVar9 = ZEXT1224(ZEXT412(0x7941) << 0x40);
      LVar8.name.str._0_4_ = 0x24a71d;
      LVar8.super_LineCol.offset = auVar9._0_8_;
      LVar8.super_LineCol.line = auVar9._8_8_;
      LVar8.super_LineCol.col = auVar9._16_8_;
      LVar8.name.str._4_4_ = 0;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_a8,0x2a,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_state == pSVar3 + (sVar4 - 2)) {
      builtin_strncpy(local_a8 + 0x10,"_state != &prev)",0x11);
      builtin_strncpy(local_a8,"check failed: (m",0x10);
      if (((s_error_flags & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
      local_78 = 0;
      uStack_70 = 0x7942;
      local_68 = 0;
      pcStack_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_58 = 0x65;
      auVar9 = ZEXT1224(ZEXT412(0x7942) << 0x40);
      LVar10.name.str._0_4_ = 0x24a71d;
      LVar10.super_LineCol.offset = auVar9._0_8_;
      LVar10.super_LineCol.line = auVar9._8_8_;
      LVar10.super_LineCol.col = auVar9._16_8_;
      LVar10.name.str._4_4_ = 0;
      LVar10.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_a8,0x21,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
    uVar2 = pSVar3[sVar4 - 2].flags;
    if ((uVar2 >> 9 & 1) != 0) {
      pSVar5 = this->m_state;
      pSVar5->flags = pSVar5->flags | uVar2 & 0x600;
      sVar7 = pSVar3[sVar4 - 2].scalar.len;
      (pSVar5->scalar).str = pSVar3[sVar4 - 2].scalar.str;
      (pSVar5->scalar).len = sVar7;
      pbVar1 = (byte *)((long)&pSVar3[sVar4 - 2].flags + 1);
      *pbVar1 = *pbVar1 & 0xf9;
      pSVar3[sVar4 - 2].scalar.str = (char *)0x0;
      pSVar3[sVar4 - 2].scalar.len = 0;
    }
  }
  return;
}

Assistant:

void Parser::_move_scalar_from_top()
{
    if(m_stack.size() < 2) return;
    State &prev = m_stack.top(1);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state == &m_stack.top());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state != &prev);
    if(prev.flags & SSCL)
    {
        _c4dbgpf("moving scalar '{}' from state[{}] to state[{}] (overwriting '{}')", prev.scalar, &prev-m_stack.begin(), m_state-m_stack.begin(), m_state->scalar);
        add_flags(prev.flags & (SSCL | QSCL));
        m_state->scalar = prev.scalar;
        rem_flags(SSCL | QSCL, &prev);
        prev.scalar.clear();
    }
}